

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O2

void __thiscall
btGeneric6DofSpring2Constraint::calculateAngleInfo(btGeneric6DofSpring2Constraint *this)

{
  btScalar bVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  RotateOrder RVar5;
  btVector3 *this_00;
  btVector3 *v;
  btScalar bVar6;
  undefined4 uVar7;
  btVector3 bVar8;
  btVector3 axis2;
  btVector3 axis0;
  btMatrix3x3 relative_frame;
  btVector3 local_90;
  btMatrix3x3 local_80;
  btMatrix3x3 local_50;
  
  btMatrix3x3::inverse(&(this->m_calculatedTransformA).m_basis);
  operator*(&local_50,&local_80,&(this->m_calculatedTransformB).m_basis);
  RVar5 = this->m_rotateOrder;
  switch(RVar5) {
  case RO_XYZ:
    matrixToEulerXYZ(&local_50,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_XZY:
    matrixToEulerXZY(&local_50,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_YXZ:
    matrixToEulerYXZ(&local_50,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_YZX:
    matrixToEulerYZX(&local_50,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_ZXY:
    matrixToEulerZXY(&local_50,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_ZYX:
    matrixToEulerZYX(&local_50,&this->m_calculatedAxisAngleDiff);
    break;
  default:
    goto switchD_00171e6c_default;
  }
  RVar5 = this->m_rotateOrder;
switchD_00171e6c_default:
  switch(RVar5) {
  case RO_XYZ:
    auVar2._4_4_ = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[0];
    auVar2._0_4_ = (int)*(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[0].m_floats;
    auVar2._8_4_ = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[0];
    bVar6 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
    uVar7 = (undefined4)*(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[0].m_floats + 2)
    ;
    bVar1 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
    break;
  case RO_XZY:
    auVar4._4_4_ = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[0];
    auVar4._0_4_ = (int)*(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[0].m_floats;
    auVar4._8_4_ = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[0];
    bVar6 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
    uVar7 = (undefined4)*(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[0].m_floats + 1)
    ;
    bVar1 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
    goto LAB_00172078;
  case RO_YXZ:
    auVar3._4_4_ = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[1];
    auVar3._0_4_ = (int)*(undefined8 *)((this->m_calculatedTransformB).m_basis.m_el[0].m_floats + 1)
    ;
    auVar3._8_4_ = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[1];
    bVar6 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
    uVar7 = (undefined4)*(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[0].m_floats + 2)
    ;
    bVar1 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
    goto LAB_00171fb7;
  case RO_YZX:
    auVar4._4_4_ = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
    auVar4._0_4_ = (int)*(undefined8 *)(this->m_calculatedTransformA).m_basis.m_el[0].m_floats;
    auVar4._8_4_ = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
    bVar6 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[1];
    uVar7 = (undefined4)*(undefined8 *)((this->m_calculatedTransformB).m_basis.m_el[0].m_floats + 1)
    ;
    bVar1 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[1];
LAB_00172078:
    local_80.m_el[0].m_floats[3] = 0.0;
    local_80.m_el[0].m_floats[0] = (btScalar)auVar4._0_4_;
    local_80.m_el[0].m_floats[1] = (btScalar)auVar4._4_4_;
    local_80.m_el[0].m_floats[2] = (btScalar)auVar4._8_4_;
    local_90.m_floats[1] = bVar6;
    local_90.m_floats[0] = (btScalar)uVar7;
    local_90.m_floats[2] = bVar1;
    local_90.m_floats[3] = 0.0;
    bVar8 = btVector3::cross(local_80.m_el,&local_90);
    *&this->m_calculatedAxis[2].m_floats = bVar8.m_floats;
    bVar8 = btVector3::cross(&local_90,this->m_calculatedAxis + 2);
    *&this->m_calculatedAxis[0].m_floats = bVar8.m_floats;
    bVar8 = btVector3::cross(this->m_calculatedAxis + 2,local_80.m_el);
    *&this->m_calculatedAxis[1].m_floats = bVar8.m_floats;
    goto switchD_00171efd_default;
  case RO_ZXY:
    auVar3._4_4_ = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
    auVar3._0_4_ = (int)*(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[0].m_floats + 1)
    ;
    auVar3._8_4_ = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
    bVar6 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[2];
    uVar7 = (undefined4)*(undefined8 *)((this->m_calculatedTransformB).m_basis.m_el[0].m_floats + 2)
    ;
    bVar1 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[2];
LAB_00171fb7:
    local_80.m_el[0].m_floats[3] = 0.0;
    local_80.m_el[0].m_floats[0] = (btScalar)auVar3._0_4_;
    local_80.m_el[0].m_floats[1] = (btScalar)auVar3._4_4_;
    local_80.m_el[0].m_floats[2] = (btScalar)auVar3._8_4_;
    this_00 = local_80.m_el;
    local_90.m_floats[1] = bVar6;
    local_90.m_floats[0] = (btScalar)uVar7;
    local_90.m_floats[2] = bVar1;
    local_90.m_floats[3] = 0.0;
    bVar8 = btVector3::cross(this_00,&local_90);
    v = this->m_calculatedAxis;
    *&this->m_calculatedAxis[0].m_floats = bVar8.m_floats;
    bVar8 = btVector3::cross(&local_90,v);
    *&this->m_calculatedAxis[1].m_floats = bVar8.m_floats;
    goto LAB_0017214f;
  case RO_ZYX:
    auVar2._4_4_ = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
    auVar2._0_4_ = (int)*(undefined8 *)(this->m_calculatedTransformA).m_basis.m_el[0].m_floats;
    auVar2._8_4_ = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
    bVar6 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[2];
    uVar7 = (undefined4)*(undefined8 *)((this->m_calculatedTransformB).m_basis.m_el[0].m_floats + 2)
    ;
    bVar1 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[2];
    break;
  default:
    goto switchD_00171efd_default;
  }
  local_80.m_el[0].m_floats[3] = 0.0;
  local_80.m_el[0].m_floats[0] = (btScalar)auVar2._0_4_;
  local_80.m_el[0].m_floats[1] = (btScalar)auVar2._4_4_;
  local_80.m_el[0].m_floats[2] = (btScalar)auVar2._8_4_;
  v = local_80.m_el;
  local_90.m_floats[1] = bVar6;
  local_90.m_floats[0] = (btScalar)uVar7;
  local_90.m_floats[2] = bVar1;
  local_90.m_floats[3] = 0.0;
  bVar8 = btVector3::cross(&local_90,v);
  this_00 = this->m_calculatedAxis + 1;
  *&this->m_calculatedAxis[1].m_floats = bVar8.m_floats;
  bVar8 = btVector3::cross(this_00,&local_90);
  *&this->m_calculatedAxis[0].m_floats = bVar8.m_floats;
LAB_0017214f:
  bVar8 = btVector3::cross(v,this_00);
  *&this->m_calculatedAxis[2].m_floats = bVar8.m_floats;
switchD_00171efd_default:
  btVector3::normalize(this->m_calculatedAxis);
  btVector3::normalize(this->m_calculatedAxis + 1);
  btVector3::normalize(this->m_calculatedAxis + 2);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::calculateAngleInfo()
{
	btMatrix3x3 relative_frame = m_calculatedTransformA.getBasis().inverse()*m_calculatedTransformB.getBasis();
	switch (m_rotateOrder)
	{
		case RO_XYZ : matrixToEulerXYZ(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_XZY : matrixToEulerXZY(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_YXZ : matrixToEulerYXZ(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_YZX : matrixToEulerYZX(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_ZXY : matrixToEulerZXY(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_ZYX : matrixToEulerZYX(relative_frame,m_calculatedAxisAngleDiff); break;
		default : btAssert(false);
	}
	// in euler angle mode we do not actually constrain the angular velocity
	// along the axes axis[0] and axis[2] (although we do use axis[1]) :
	//
	//    to get			constrain w2-w1 along		...not
	//    ------			---------------------		------
	//    d(angle[0])/dt = 0	ax[1] x ax[2]			ax[0]
	//    d(angle[1])/dt = 0	ax[1]
	//    d(angle[2])/dt = 0	ax[0] x ax[1]			ax[2]
	//
	// constraining w2-w1 along an axis 'a' means that a'*(w2-w1)=0.
	// to prove the result for angle[0], write the expression for angle[0] from
	// GetInfo1 then take the derivative. to prove this for angle[2] it is
	// easier to take the euler rate expression for d(angle[2])/dt with respect
	// to the components of w and set that to 0.
	switch (m_rotateOrder)
	{
	case RO_XYZ :
		{
			//Is this the "line of nodes" calculation choosing planes YZ (B coordinate system) and xy (A coordinate system)? (http://en.wikipedia.org/wiki/Euler_angles)
			//The two planes are non-homologous, so this is a Tait�Bryan angle formalism and not a proper Euler
			//Extrinsic rotations are equal to the reversed order intrinsic rotations so the above xyz extrinsic rotations (axes are fixed) are the same as the zy'x" intrinsic rotations (axes are refreshed after each rotation)
			//that is why xy and YZ planes are chosen (this will describe a zy'x" intrinsic rotation) (see the figure on the left at http://en.wikipedia.org/wiki/Euler_angles under Tait�Bryan angles)
			// x' = Nperp = N.cross(axis2)
			// y' = N = axis2.cross(axis0)	
			// z' = z
			//
			// x" = X
			// y" = y'
			// z" = ??
			//in other words:
			//first rotate around z
			//second rotate around y'= z.cross(X)
			//third rotate around x" = X
			//Original XYZ extrinsic rotation order. 
			//Planes: xy and YZ normals: z, X.  Plane intersection (N) is z.cross(X)
			btVector3 axis0 = m_calculatedTransformB.getBasis().getColumn(0);
			btVector3 axis2 = m_calculatedTransformA.getBasis().getColumn(2);
			m_calculatedAxis[1] = axis2.cross(axis0);
			m_calculatedAxis[0] = m_calculatedAxis[1].cross(axis2);
			m_calculatedAxis[2] = axis0.cross(m_calculatedAxis[1]);
			break;
		}
	case RO_XZY :
		{
			//planes: xz,ZY normals: y, X
			//first rotate around y
			//second rotate around z'= y.cross(X)
			//third rotate around x" = X
			btVector3 axis0 = m_calculatedTransformB.getBasis().getColumn(0);
			btVector3 axis1 = m_calculatedTransformA.getBasis().getColumn(1);
			m_calculatedAxis[2] = axis0.cross(axis1);
			m_calculatedAxis[0] = axis1.cross(m_calculatedAxis[2]);
			m_calculatedAxis[1] = m_calculatedAxis[2].cross(axis0);
			break;
		}
	case RO_YXZ :
		{
			//planes: yx,XZ normals: z, Y
			//first rotate around z
			//second rotate around x'= z.cross(Y)
			//third rotate around y" = Y
			btVector3 axis1 = m_calculatedTransformB.getBasis().getColumn(1);
			btVector3 axis2 = m_calculatedTransformA.getBasis().getColumn(2);
			m_calculatedAxis[0] = axis1.cross(axis2);
			m_calculatedAxis[1] = axis2.cross(m_calculatedAxis[0]);
			m_calculatedAxis[2] = m_calculatedAxis[0].cross(axis1);
			break;
		}
	case RO_YZX :
		{
			//planes: yz,ZX normals: x, Y
			//first rotate around x
			//second rotate around z'= x.cross(Y)
			//third rotate around y" = Y
			btVector3 axis0 = m_calculatedTransformA.getBasis().getColumn(0);
			btVector3 axis1 = m_calculatedTransformB.getBasis().getColumn(1);
			m_calculatedAxis[2] = axis0.cross(axis1);
			m_calculatedAxis[0] = axis1.cross(m_calculatedAxis[2]);
			m_calculatedAxis[1] = m_calculatedAxis[2].cross(axis0);
			break;
		}
	case RO_ZXY :
		{
			//planes: zx,XY normals: y, Z
			//first rotate around y
			//second rotate around x'= y.cross(Z)
			//third rotate around z" = Z
			btVector3 axis1 = m_calculatedTransformA.getBasis().getColumn(1);
			btVector3 axis2 = m_calculatedTransformB.getBasis().getColumn(2);
			m_calculatedAxis[0] = axis1.cross(axis2);
			m_calculatedAxis[1] = axis2.cross(m_calculatedAxis[0]);
			m_calculatedAxis[2] = m_calculatedAxis[0].cross(axis1);
			break;
		}
	case RO_ZYX :
		{
			//planes: zy,YX normals: x, Z
			//first rotate around x
			//second rotate around y' = x.cross(Z)
			//third rotate around z" = Z
			btVector3 axis0 = m_calculatedTransformA.getBasis().getColumn(0);
			btVector3 axis2 = m_calculatedTransformB.getBasis().getColumn(2);
			m_calculatedAxis[1] = axis2.cross(axis0);
			m_calculatedAxis[0] = m_calculatedAxis[1].cross(axis2);
			m_calculatedAxis[2] = axis0.cross(m_calculatedAxis[1]);
			break;
		}
	default:
		btAssert(false);
	}

	m_calculatedAxis[0].normalize();
	m_calculatedAxis[1].normalize();
	m_calculatedAxis[2].normalize();

}